

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

size_t __thiscall
pstore::file::file_base::read_span<pstore::gsl::span<char,_1l>,void>
          (file_base *this,span<char,__1L> *s)

{
  int iVar1;
  undefined4 extraout_var;
  not_null<void_*> local_20;
  
  if (-1 < (s->storage_).super_extent_type<_1L>.size_) {
    local_20.ptr_ = (s->storage_).data_;
    gsl::not_null<void_*>::ensure_invariant(&local_20);
    iVar1 = (*this->_vptr_file_base[0xd])
                      (this,local_20.ptr_,(s->storage_).super_extent_type<_1L>.size_);
    return CONCAT44(extraout_var,iVar1);
  }
  assert_failed("size >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/os/file.hpp"
                ,0xde);
}

Assistant:

std::size_t read_span (SpanType const & s) {
                auto const size = s.size_bytes ();
                PSTORE_ASSERT (size >= 0);
                using utype = typename std::make_unsigned<decltype (size)>::type;
                return this->read_buffer (s.data (), static_cast<utype> (s.size_bytes ()));
            }